

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O1

Gia_Man_t * Cec_ManCombSpecReduce(Gia_Man_t *p,Vec_Int_t **pvOutputs,int fRings)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  int *piVar12;
  Gia_Obj_t *pGVar13;
  Gia_Man_t *pGVar14;
  ulong uVar15;
  ulong uVar16;
  Gia_Obj_t *pGVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecChoice.c"
                  ,0x66,"Gia_Man_t *Cec_ManCombSpecReduce(Gia_Man_t *, Vec_Int_t **, int)");
  }
  Gia_ManSetPhase(p);
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar1);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar1);
  }
  p_00->pName = pcVar9;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar1);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar1);
  }
  p_00->pSpec = pcVar9;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar20 = 0;
    do {
      iVar6 = pVVar11->pArray[lVar20];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00640462;
      pGVar17 = p->pObjs;
      if (pGVar17 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar15 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar15 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar15 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar13 = p_00->pObjs;
      if ((pGVar10 < pGVar13) || (pGVar13 + p_00->nObjs <= pGVar10)) goto LAB_00640481;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar13) >> 2) * -0x55555555);
      pGVar13 = p_00->pObjs;
      if ((pGVar10 < pGVar13) || (pGVar13 + p_00->nObjs <= pGVar10)) goto LAB_00640481;
      pGVar17[iVar6].Value = (int)((ulong)((long)pGVar10 - (long)pGVar13) >> 2) * 0x55555556;
      lVar20 = lVar20 + 1;
      pVVar11 = p->vCis;
    } while (lVar20 < pVVar11->nSize);
  }
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 1000;
  pVVar11->nSize = 0;
  piVar12 = (int *)malloc(4000);
  pVVar11->pArray = piVar12;
  *pvOutputs = pVVar11;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 1000;
  pVVar11->nSize = 0;
  piVar12 = (int *)malloc(4000);
  pVVar11->pArray = piVar12;
  uVar3 = p->nObjs;
  uVar15 = (ulong)uVar3;
  if (fRings == 0) {
    if (1 < (int)uVar3) {
      lVar20 = 1;
      lVar21 = 0xc;
      do {
        pGVar17 = p->pObjs;
        uVar16 = (ulong)(uint)p->pReprs[lVar20] & 0xfffffff;
        if (uVar16 == 0xfffffff) {
          pGVar13 = (Gia_Obj_t *)0x0;
        }
        else {
          if ((int)uVar15 <= (int)uVar16) goto LAB_00640462;
          pGVar13 = pGVar17 + uVar16;
        }
        if (pGVar13 != (Gia_Obj_t *)0x0) {
          if (((uint)p->pReprs[lVar20] & 0xfffffff) == 0) {
            uVar3 = 0;
          }
          else {
            uVar3 = Cec_ManCombSpecReal(p_00,p,pGVar13);
          }
          pGVar10 = (Gia_Obj_t *)(&pGVar17->field_0x0 + lVar21);
          uVar19 = Cec_ManCombSpecReal(p_00,p,pGVar10);
          if ((int)uVar19 < 0) goto LAB_006404a0;
          uVar19 = uVar19 ^ ((uint)((ulong)*(undefined8 *)pGVar13 >> 0x20) ^
                            (uint)((ulong)*(undefined8 *)pGVar10 >> 0x20)) >> 0x1f;
          if (uVar3 != uVar19) {
            pGVar2 = p->pObjs;
            if ((pGVar13 < pGVar2) || (pGVar2 + p->nObjs <= pGVar13)) goto LAB_00640481;
            Vec_IntPush(*pvOutputs,(int)((ulong)((long)pGVar13 - (long)pGVar2) >> 2) * -0x55555555);
            pGVar13 = p->pObjs;
            if ((pGVar10 < pGVar13) || (pGVar13 + p->nObjs <= pGVar10)) goto LAB_00640481;
            Vec_IntPush(*pvOutputs,
                        (int)((ulong)((long)pGVar17 + (lVar21 - (long)pGVar13)) >> 2) * -0x55555555)
            ;
            iVar6 = Gia_ManHashXor(p_00,uVar3,uVar19);
            Vec_IntPush(pVVar11,iVar6);
          }
        }
        lVar20 = lVar20 + 1;
        uVar15 = (ulong)p->nObjs;
        lVar21 = lVar21 + 0xc;
      } while (lVar20 < (long)uVar15);
    }
  }
  else if (1 < (int)uVar3) {
    uVar15 = 1;
    do {
      pGVar17 = p->pObjs + uVar15;
      uVar3 = (uint)p->pReprs[uVar15] & 0xfffffff;
      uVar19 = (uint)uVar15;
      if (uVar3 == 0) {
        uVar3 = Cec_ManCombSpecReal(p_00,p,pGVar17);
        if ((int)uVar3 < 0) goto LAB_006404a0;
        uVar4 = -(int)((long)*(undefined8 *)pGVar17 >> 0x3f);
        if (uVar3 != uVar4) {
          uVar3 = uVar3 ^ uVar4;
          Vec_IntPush(*pvOutputs,0);
          Vec_IntPush(*pvOutputs,uVar19);
LAB_006400ba:
          Vec_IntPush(pVVar11,uVar3);
        }
      }
      else if ((uVar3 == 0xfffffff) && (0 < p->pNexts[uVar15])) {
        if (p->pNexts[uVar15] < 1) {
          __assert_fail("Gia_ObjIsHead(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecChoice.c"
                        ,0x84,"Gia_Man_t *Cec_ManCombSpecReduce(Gia_Man_t *, Vec_Int_t **, int)");
        }
        uVar4 = p->pNexts[uVar15];
        uVar16 = uVar15 & 0xffffffff;
        uVar3 = uVar19;
        while (uVar7 = uVar4, 0 < (int)uVar7) {
          iVar6 = (int)uVar16;
          if ((iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00640462;
          uVar3 = Cec_ManCombSpecReal(p_00,p,p->pObjs + uVar16);
          if (p->nObjs <= (int)uVar7) goto LAB_00640462;
          uVar4 = Cec_ManCombSpecReal(p_00,p,p->pObjs + uVar7);
          if (p->nObjs <= iVar6) goto LAB_00640462;
          if ((int)uVar3 < 0) goto LAB_006404a0;
          if (p->nObjs <= (int)uVar7) goto LAB_00640462;
          if ((int)uVar4 < 0) goto LAB_006404a0;
          uVar5 = (uint)((ulong)*(undefined8 *)pGVar17 >> 0x20);
          uVar4 = uVar4 ^ ((uint)((ulong)*(undefined8 *)(p->pObjs + uVar7) >> 0x20) ^ uVar5) >> 0x1f
          ;
          if (((uVar4 != 1) &&
              (uVar5 = -((int)(uVar5 ^ (uint)((ulong)*(undefined8 *)(p->pObjs + uVar16) >> 0x20)) >>
                        0x1f), uVar3 != uVar5)) && (uVar3 = uVar3 ^ uVar5, uVar3 != uVar4)) {
            Vec_IntPush(*pvOutputs,iVar6);
            Vec_IntPush(*pvOutputs,uVar7);
            iVar6 = Gia_ManHashAnd(p_00,uVar3,uVar4 ^ 1);
            Vec_IntPush(pVVar11,iVar6);
          }
          uVar16 = (ulong)uVar7;
          uVar3 = uVar7;
          uVar4 = p->pNexts[uVar7];
        }
        if (((int)uVar3 < 0) || (p->nObjs <= (int)uVar3)) {
LAB_00640462:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar4 = Cec_ManCombSpecReal(p_00,p,p->pObjs + uVar3);
        if ((long)p->nObjs <= (long)uVar15) goto LAB_00640462;
        uVar7 = Cec_ManCombSpecReal(p_00,p,p->pObjs + uVar15);
        if (p->nObjs <= (int)uVar3) goto LAB_00640462;
        if ((int)uVar4 < 0) {
LAB_006404a0:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        if ((long)p->nObjs <= (long)uVar15) goto LAB_00640462;
        if ((int)uVar7 < 0) goto LAB_006404a0;
        uVar5 = (uint)((ulong)*(undefined8 *)pGVar17 >> 0x20);
        uVar7 = uVar7 ^ ((uint)((ulong)*(undefined8 *)(p->pObjs + uVar15) >> 0x20) ^ uVar5) >> 0x1f;
        if (((uVar7 != 1) &&
            (uVar5 = -((int)(uVar5 ^ (uint)((ulong)*(undefined8 *)(p->pObjs + uVar3) >> 0x20)) >>
                      0x1f), uVar4 != uVar5)) && (uVar4 = uVar4 ^ uVar5, uVar4 != uVar7)) {
          Vec_IntPush(*pvOutputs,uVar3);
          Vec_IntPush(*pvOutputs,uVar19);
          uVar3 = Gia_ManHashAnd(p_00,uVar4,uVar7 ^ 1);
          goto LAB_006400ba;
        }
      }
      uVar15 = uVar15 + 1;
    } while ((long)uVar15 < (long)p->nObjs);
  }
  iVar6 = pVVar11->nSize;
  if (0 < (long)iVar6) {
    piVar12 = pVVar11->pArray;
    lVar20 = 0;
    do {
      uVar3 = piVar12[lVar20];
      if ((int)uVar3 < 0) {
LAB_006404bf:
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      uVar19 = uVar3 >> 1;
      if (p_00->nObjs <= (int)uVar19) goto LAB_006404bf;
      if ((~*(uint *)(p_00->pObjs + uVar19) & 0x1fffffff) != 0 &&
          (int)*(uint *)(p_00->pObjs + uVar19) < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar13 = Gia_ManAppendObj(p_00);
      uVar15 = *(ulong *)pGVar13;
      *(ulong *)pGVar13 = uVar15 | 0x80000000;
      pGVar17 = p_00->pObjs;
      if ((pGVar13 < pGVar17) || (pGVar17 + p_00->nObjs <= pGVar13)) {
LAB_00640481:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar16 = (ulong)(((uint)((int)pGVar13 - (int)pGVar17) >> 2) * -0x55555555 - uVar19 &
                      0x1fffffff);
      uVar18 = (ulong)((uVar3 & 1) << 0x1d);
      *(ulong *)pGVar13 = uVar18 | uVar15 & 0xffffffffc0000000 | 0x80000000 | uVar16;
      *(ulong *)pGVar13 =
           uVar18 | uVar15 & 0xe0000000c0000000 | 0x80000000 | uVar16 |
           (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar17 = p_00->pObjs;
      if ((pGVar13 < pGVar17) || (pGVar17 + p_00->nObjs <= pGVar13)) goto LAB_00640481;
      Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar13 - (long)pGVar17) >> 2) * -0x55555555);
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar13 + -(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff),pGVar13)
        ;
      }
      if ((pGVar13 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar13)) goto LAB_00640481;
      lVar20 = lVar20 + 1;
    } while (iVar6 != lVar20);
  }
  if (pVVar11->pArray != (int *)0x0) {
    free(pVVar11->pArray);
    pVVar11->pArray = (int *)0x0;
  }
  free(pVVar11);
  Gia_ManHashStop(p_00);
  pGVar14 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar14;
}

Assistant:

Gia_Man_t * Cec_ManCombSpecReduce( Gia_Man_t * p, Vec_Int_t ** pvOutputs, int fRings )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    Vec_Int_t * vXorLits;
    int i, iPrev, iObj, iPrevNew, iObjNew;
    assert( p->pReprs != NULL );
    Gia_ManSetPhase( p );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    *pvOutputs = Vec_IntAlloc( 1000 );
    vXorLits = Vec_IntAlloc( 1000 );
    if ( fRings )
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsConst( p, i ) )
            {
                iObjNew = Cec_ManCombSpecReal( pNew, p, pObj );
                iObjNew = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pObj) );
                if ( iObjNew != 0 )
                {
                    Vec_IntPush( *pvOutputs, 0 );
                    Vec_IntPush( *pvOutputs, i );
                    Vec_IntPush( vXorLits, iObjNew );
                }
            }
            else if ( Gia_ObjIsHead( p, i ) )
            {
                iPrev = i;
                Gia_ClassForEachObj1( p, i, iObj )
                {
                    iPrevNew = Cec_ManCombSpecReal( pNew, p, Gia_ManObj(p, iPrev) );
                    iObjNew  = Cec_ManCombSpecReal( pNew, p, Gia_ManObj(p, iObj) );
                    iPrevNew = Abc_LitNotCond( iPrevNew, Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iPrev)) );
                    iObjNew  = Abc_LitNotCond( iObjNew,  Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iObj)) );
                    if ( iPrevNew != iObjNew && iPrevNew != 0 && iObjNew != 1 )
                    {
                        Vec_IntPush( *pvOutputs, iPrev );
                        Vec_IntPush( *pvOutputs, iObj );
                        Vec_IntPush( vXorLits, Gia_ManHashAnd(pNew, iPrevNew, Abc_LitNot(iObjNew)) );
                    }
                    iPrev = iObj;
                }
                iObj = i;
                iPrevNew = Cec_ManCombSpecReal( pNew, p, Gia_ManObj(p, iPrev) );
                iObjNew  = Cec_ManCombSpecReal( pNew, p, Gia_ManObj(p, iObj) );
                iPrevNew = Abc_LitNotCond( iPrevNew, Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iPrev)) );
                iObjNew  = Abc_LitNotCond( iObjNew,  Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iObj)) );
                if ( iPrevNew != iObjNew && iPrevNew != 0 && iObjNew != 1 )
                {
                    Vec_IntPush( *pvOutputs, iPrev );
                    Vec_IntPush( *pvOutputs, iObj );
                    Vec_IntPush( vXorLits, Gia_ManHashAnd(pNew, iPrevNew, Abc_LitNot(iObjNew)) );
                }
            }
        }
    }
    else
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
            if ( pRepr == NULL )
                continue;
            iPrevNew = Gia_ObjIsConst(p, i)? 0 : Cec_ManCombSpecReal( pNew, p, pRepr );
            iObjNew  = Cec_ManCombSpecReal( pNew, p, pObj );
            iObjNew  = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
            if ( iPrevNew != iObjNew )
            {
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pRepr) );
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pObj) );
                Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, iPrevNew, iObjNew) );
            }
        }
    }
    Vec_IntForEachEntry( vXorLits, iObjNew, i )
        Gia_ManAppendCo( pNew, iObjNew );
    Vec_IntFree( vXorLits );
    Gia_ManHashStop( pNew );
//Abc_Print( 1, "Before sweeping = %d\n", Gia_ManAndNum(pNew) );
    pNew = Gia_ManCleanup( pTemp = pNew );
//Abc_Print( 1, "After sweeping = %d\n", Gia_ManAndNum(pNew) );
    Gia_ManStop( pTemp );
    return pNew;
}